

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_10b450::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  PixelType PVar2;
  size_t __n;
  bool bVar3;
  PixelType PVar4;
  Array2D<void_*> *pAVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  int *piVar14;
  ChannelList *this;
  ChannelList *pCVar15;
  void *pvVar16;
  void *pvVar17;
  ostream *poVar18;
  long *plVar19;
  int iVar20;
  int iVar21;
  undefined7 in_register_00000009;
  ulong uVar22;
  long lVar23;
  int k_2;
  long lVar24;
  uint uVar25;
  long lVar26;
  char *pcVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  void *pvVar31;
  ulong uVar32;
  int k;
  ulong uVar33;
  ulong uVar34;
  int k_1;
  ulong __n_00;
  int iVar35;
  ulong uVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar44;
  Array<Imf_3_2::Array2D<void_*>_> data;
  void *local_310;
  int local_2e0;
  DeepScanLineInputFile file;
  string str;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  DeepSlice local_68 [56];
  
  __n_00 = (ulong)(uint)channelCount;
  iVar20 = (int)CONCAT71(in_register_00000009,randomChannels);
  if (iVar20 == 0) {
    pcVar27 = " reading all channels ";
    lVar23 = 0x16;
  }
  else {
    pcVar27 = " reading random channels ";
    lVar23 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar27,lVar23);
  std::ostream::flush();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  Imf_3_2::DeepScanLineInputFile::header();
  puVar10 = (undefined8 *)Imf_3_2::Header::displayWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar43 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar44 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar39._4_4_ = iVar43;
  auVar39._0_4_ = iVar43;
  auVar39._8_4_ = iVar44;
  auVar39._12_4_ = iVar44;
  iVar20 = movmskpd(iVar20,auVar39);
  if ((iVar20 != 3) ||
     (iVar43 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar44 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar40._4_4_ = iVar43, auVar40._0_4_ = iVar43, auVar40._8_4_ = iVar44, auVar40._12_4_ = iVar44
     , iVar43 = movmskpd((int)puVar11,auVar40), iVar43 != 3)) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x109,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::dataWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar43 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar44 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar41._4_4_ = iVar43;
  auVar41._0_4_ = iVar43;
  auVar41._8_4_ = iVar44;
  auVar41._12_4_ = iVar44;
  iVar20 = movmskpd(iVar20,auVar41);
  if ((iVar20 != 3) ||
     (iVar20 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar43 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar42._4_4_ = iVar20, auVar42._0_4_ = iVar20, auVar42._8_4_ = iVar43, auVar42._12_4_ = iVar43
     , iVar20 = movmskpd((int)puVar11,auVar42), iVar20 != 3)) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar37 = *pfVar12;
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar37 != *pfVar12) || (NAN(fVar37) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
  pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
  if ((((*pfVar12 != *pfVar13) || (NAN(*pfVar12) || NAN(*pfVar13))) || (pfVar12[1] != pfVar13[1]))
     || (NAN(pfVar12[1]) || NAN(pfVar13[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar37 = *pfVar12;
  pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar37 != *pfVar12) || (NAN(fVar37) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::lineOrder();
  iVar20 = *piVar14;
  piVar14 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar20 != *piVar14) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::compression();
  iVar20 = *piVar14;
  piVar14 = (int *)Imf_3_2::Header::compression();
  if (iVar20 != *piVar14) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this = (ChannelList *)Imf_3_2::Header::channels();
  pCVar15 = (ChannelList *)Imf_3_2::Header::channels();
  cVar6 = Imf_3_2::ChannelList::operator==(this,pCVar15);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  puVar11 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  __n = puVar10[1];
  if ((__n != puVar11[1]) ||
     ((__n != 0 && (iVar20 = bcmp((void *)*puVar10,(void *)*puVar11,__n), iVar20 != 0)))) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  piVar14 = (int *)Imf_3_2::Header::dataWindow();
  iVar20 = piVar14[2];
  iVar43 = *piVar14;
  uVar22 = ((long)iVar20 - (long)iVar43) + 1;
  iVar44 = piVar14[3] - piVar14[1];
  uVar7 = iVar44 + 1;
  uVar36 = (long)(int)uVar7 * uVar22;
  pvVar16 = operator_new__(-(ulong)(uVar36 >> 0x3e != 0) | uVar36 * 4);
  uVar8 = random_int(3);
  uVar25 = uVar8 + channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)(int)uVar25);
  if (0 < (int)uVar25) {
    lVar23 = 0;
    do {
      pAVar5 = data._data;
      pvVar17 = operator_new__(-(ulong)(uVar36 >> 0x3d != 0) | uVar36 * 8);
      pvVar31 = *(void **)((long)&pAVar5->_data + lVar23);
      if (pvVar31 != (void *)0x0) {
        operator_delete__(pvVar31);
      }
      *(long *)((long)&pAVar5->_sizeX + lVar23) = (long)(int)uVar7;
      *(ulong *)((long)&pAVar5->_sizeY + lVar23) = uVar22;
      *(void **)((long)&pAVar5->_data + lVar23) = pvVar17;
      lVar23 = lVar23 + 0x18;
    } while ((ulong)uVar25 * 0x18 != lVar23);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  iVar21 = (int)uVar22;
  lVar23 = (long)iVar21;
  uVar36 = uVar22 * 4;
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((long)pvVar16 + piVar14[1] * lVar23 * -4 + (long)*piVar14 * -4),4,uVar36,1,1,
             0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    lVar24 = 0x10;
    uVar33 = 0;
    iVar35 = 0;
    do {
      if (randomChannels) {
        iVar9 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] = iVar9;
        if (!randomChannels || iVar9 == 1) goto LAB_0014ff8e;
      }
      else {
LAB_0014ff8e:
        PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar33 * 4);
        PVar4 = (uint)(PVar2 != UINT) * 3;
        if (PVar2 == HALF) {
          PVar4 = PVar2;
        }
        if (PVar2 == FLOAT) {
          PVar4 = PVar2;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1e0,(int)uVar33);
        std::__cxx11::stringbuf::str();
        iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
        uVar32 = (ulong)(iVar9 == 0) << 2;
        if (iVar9 == 1) {
          uVar32 = 2;
        }
        if (iVar9 == 2) {
          uVar32 = 4;
        }
        Imf_3_2::DeepSlice::DeepSlice
                  (local_68,PVar4,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar24) + (long)*piVar14 * -8 +
                           piVar14[1] * lVar23 * -8),8,(long)(iVar21 * 8),uVar32,1,1,0.0,false,false
                  );
        Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar35 = iVar35 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_170);
      }
      uVar33 = uVar33 + 1;
      lVar24 = lVar24 + 0x18;
    } while (__n_00 != uVar33);
    if (iVar35 != 0) {
      if (0 < (int)uVar8) {
        lVar24 = __n_00 * 0x18;
        uVar33 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar18 = (ostream *)std::ostream::operator<<(local_1e0,(int)uVar33);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_3_2::DeepSlice::DeepSlice
                    (local_68,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar24) + (long)*piVar14 * -8 +
                             piVar14[1] * lVar23 * -8),8,(long)(iVar21 * 8),4,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_170);
          uVar33 = uVar33 + 1;
          lVar24 = lVar24 + 0x18;
        } while (uVar8 != uVar33);
      }
      Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      local_2e0 = (int)((long)iVar20 - (long)iVar43);
      if (bulkRead) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
        std::ostream::flush();
        Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file,piVar14[1]);
        iVar20 = piVar14[1];
        if (iVar20 <= piVar14[3]) {
          lVar24 = (anonymous_namespace)::sampleCount._8_8_ * 4;
          lVar29 = 0;
          pvVar31 = pvVar16;
          lVar23 = 0;
          do {
            if (-1 < local_2e0) {
              uVar33 = 0;
              do {
                if (*(int *)((long)pvVar31 + uVar33 * 4) !=
                    *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar29 + uVar33 * 4)) {
                  __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                ,0x16f,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
                uVar33 = uVar33 + 1;
              } while ((uVar22 & 0xffffffff) != uVar33);
            }
            if (-1 < local_2e0) {
              uVar33 = 0;
              do {
                uVar25 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar23 * uVar22 * 4);
                uVar32 = (ulong)uVar25 * 4;
                lVar26 = 4;
                uVar34 = 0;
                do {
                  if ((uVar25 == 0) ||
                     ((randomChannels &&
                      (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar34] != 1)))) {
                    pvVar17 = (void *)0x0;
LAB_001503e7:
                    *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + uVar33 * 8) =
                         pvVar17;
                  }
                  else {
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 0) {
                      pvVar17 = operator_new__(uVar32);
                      *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar23 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + uVar33 * 8) =
                           pvVar17;
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 1) {
                      pvVar17 = operator_new__((ulong)uVar25 * 2);
                      *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar23 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + uVar33 * 8) =
                           pvVar17;
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 2) {
                      pvVar17 = operator_new__(uVar32);
                      goto LAB_001503e7;
                    }
                  }
                  uVar34 = uVar34 + 1;
                  lVar26 = lVar26 + 6;
                } while (__n_00 != uVar34);
                if (0 < (int)uVar8) {
                  uVar25 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar23 * uVar22 * 4);
                  lVar26 = __n_00 * 0x18 + 0x10;
                  uVar32 = (ulong)uVar8;
                  do {
                    pvVar17 = operator_new__((ulong)uVar25 << 2);
                    *(void **)(*(long *)((long)data._data + lVar26 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar26) + uVar33 * 8) =
                         pvVar17;
                    lVar26 = lVar26 + 0x18;
                    uVar32 = uVar32 - 1;
                  } while (uVar32 != 0);
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 != (uVar22 & 0xffffffff));
            }
            iVar20 = piVar14[1];
            lVar29 = lVar29 + lVar24;
            pvVar31 = (void *)((long)pvVar31 + uVar36);
            bVar3 = lVar23 < piVar14[3] - iVar20;
            lVar23 = lVar23 + 1;
          } while (bVar3);
        }
        Imf_3_2::DeepScanLineInputFile::readPixels((int)&file,iVar20);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
        std::ostream::flush();
        if (piVar14[1] <= piVar14[3]) {
          lVar24 = 0;
          lVar23 = 0;
          local_310 = pvVar16;
          do {
            Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&file);
            if (-1 < local_2e0) {
              uVar33 = 0;
              do {
                if (*(int *)((long)local_310 + uVar33 * 4) !=
                    *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar24 +
                             (anonymous_namespace)::sampleCount._16_8_ + uVar33 * 4)) {
                  __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                ,0x199,
                                "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                               );
                }
                uVar33 = uVar33 + 1;
              } while ((uVar22 & 0xffffffff) != uVar33);
            }
            if (-1 < local_2e0) {
              uVar33 = 0;
              do {
                uVar25 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar23 * uVar22 * 4);
                uVar32 = (ulong)uVar25 * 4;
                lVar29 = 4;
                uVar34 = 0;
                do {
                  if ((uVar25 == 0) ||
                     ((randomChannels &&
                      (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar34] != 1)))) {
                    pvVar31 = (void *)0x0;
LAB_001506e5:
                    *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + uVar33 * 8) =
                         pvVar31;
                  }
                  else {
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 0) {
                      pvVar31 = operator_new__(uVar32);
                      *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar23 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + uVar33 * 8) =
                           pvVar31;
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 1) {
                      pvVar31 = operator_new__((ulong)uVar25 * 2);
                      *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar23 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + uVar33 * 8) =
                           pvVar31;
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar34 * 4) == 2) {
                      pvVar31 = operator_new__(uVar32);
                      goto LAB_001506e5;
                    }
                  }
                  uVar34 = uVar34 + 1;
                  lVar29 = lVar29 + 6;
                } while (__n_00 != uVar34);
                if (0 < (int)uVar8) {
                  uVar25 = *(uint *)((long)pvVar16 + uVar33 * 4 + lVar23 * uVar22 * 4);
                  uVar32 = (ulong)uVar8;
                  lVar29 = __n_00 * 0x18 + 0x10;
                  do {
                    pvVar31 = operator_new__((ulong)uVar25 << 2);
                    *(void **)(*(long *)((long)data._data + lVar29 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar29) + uVar33 * 8) =
                         pvVar31;
                    lVar29 = lVar29 + 0x18;
                    uVar32 = uVar32 - 1;
                  } while (uVar32 != 0);
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 != (uVar22 & 0xffffffff));
            }
            Imf_3_2::DeepScanLineInputFile::readPixels((int)&file);
            lVar24 = lVar24 + 4;
            local_310 = (void *)((long)local_310 + uVar36);
            bVar3 = lVar23 < (long)piVar14[3] - (long)piVar14[1];
            lVar23 = lVar23 + 1;
          } while (bVar3);
        }
      }
      if (-1 < iVar44) {
        uVar36 = 0;
        do {
          if (-1 < local_2e0) {
            iVar43 = (int)uVar36;
            iVar20 = iVar43 * iVar21;
            uVar33 = 0;
            do {
              iVar35 = (int)uVar33;
              uVar30 = (uint)(iVar35 + iVar20) % 0x801;
              fVar37 = (float)uVar30;
              uVar28 = (uint)(iVar35 + iVar20) % 0x801;
              uVar25 = (uint)(iVar35 + iVar20) % 0x801;
              fVar38 = (float)uVar25;
              uVar32 = 0;
              do {
                if (((!randomChannels) ||
                    (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar32] == 1)) &&
                   (*(int *)((anonymous_namespace)::sampleCount._8_8_ * uVar36 * 4 +
                             (anonymous_namespace)::sampleCount._16_8_ + uVar33 * 4) != 0)) {
                  uVar34 = 0;
                  do {
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 0) {
                      pvVar31 = data._data[uVar32]._data
                                [data._data[uVar32]._sizeY * uVar36 + uVar33];
                      if (*(uint *)((long)pvVar31 + uVar34 * 4) != uVar28) {
                        poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar35);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar43);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18," error, should be ",0x12);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar28);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                        poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) +
                                        (char)poVar18);
                        std::ostream::put((char)poVar18);
                        std::ostream::flush();
                        std::ostream::flush();
                      }
                      if (*(uint *)((long)pvVar31 + uVar34 * 4) != uVar28) {
                        __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                      ,0x1d0,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 1) {
                      pvVar31 = data._data[uVar32]._data
                                [data._data[uVar32]._sizeY * uVar36 + uVar33];
                      fVar1 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)((long)pvVar31 + uVar34 * 2) * 4);
                      if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                        poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar35);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar43);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18," error, should be ",0x12);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar30);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                        plVar19 = (long *)::operator<<(poVar18,(half)*(uint16_t *)
                                                                      ((long)pvVar31 + uVar34 * 2));
                        std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
                        std::ostream::put((char)plVar19);
                        std::ostream::flush();
                        std::ostream::flush();
                      }
                      fVar1 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)
                                                ((long)data._data[uVar32]._data
                                                       [data._data[uVar32]._sizeY * uVar36 + uVar33]
                                                + uVar34 * 2) * 4);
                      if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                        __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                      ,0x1dc,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 2) {
                      pvVar31 = data._data[uVar32]._data
                                [data._data[uVar32]._sizeY * uVar36 + uVar33];
                      fVar1 = *(float *)((long)pvVar31 + uVar34 * 4);
                      if ((fVar1 != fVar38) || (NAN(fVar1) || NAN(fVar38))) {
                        poVar18 = (ostream *)std::ostream::operator<<(&std::cout,iVar35);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar43);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18," error, should be ",0x12);
                        poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar25);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", is ",5);
                        poVar18 = std::ostream::_M_insert<double>
                                            ((double)*(float *)((long)pvVar31 + uVar34 * 4));
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) +
                                        (char)poVar18);
                        std::ostream::put((char)poVar18);
                        std::ostream::flush();
                        std::ostream::flush();
                      }
                      fVar1 = *(float *)((long)data._data[uVar32]._data
                                               [data._data[uVar32]._sizeY * uVar36 + uVar33] +
                                        uVar34 * 4);
                      if ((fVar1 != fVar38) || (NAN(fVar1) || NAN(fVar38))) {
                        __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                                      ,0x1e8,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    uVar34 = uVar34 + 1;
                  } while (uVar34 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * uVar36 * 4
                                              + (anonymous_namespace)::sampleCount._16_8_ +
                                             uVar33 * 4));
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != __n_00);
              uVar33 = uVar33 + 1;
            } while (uVar33 != (uVar22 & 0xffffffff));
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar7);
      }
      if (-1 < iVar44) {
        uVar36 = 0;
        do {
          if (-1 < local_2e0) {
            uVar33 = 0;
            do {
              lVar23 = 4;
              uVar32 = 0;
              do {
                if ((!randomChannels) ||
                   (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar32] == 1)) {
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 0) &&
                     (pvVar31 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar36 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                          uVar33 * 8), pvVar31 != (void *)0x0)) {
                    operator_delete__(pvVar31);
                  }
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 1) &&
                     (pvVar31 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar36 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                          uVar33 * 8), pvVar31 != (void *)0x0)) {
                    operator_delete__(pvVar31);
                  }
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 2) &&
                     (pvVar31 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar36 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                          uVar33 * 8), pvVar31 != (void *)0x0)) {
                    operator_delete__(pvVar31);
                  }
                }
                uVar32 = uVar32 + 1;
                lVar23 = lVar23 + 6;
              } while (__n_00 != uVar32);
              uVar32 = (ulong)uVar8;
              lVar23 = __n_00 * 0x18 + 0x10;
              if (0 < (int)uVar8) {
                do {
                  pvVar31 = *(void **)(*(long *)((long)data._data + lVar23 + -8) * uVar36 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar23) + uVar33 * 8)
                  ;
                  if (pvVar31 != (void *)0x0) {
                    operator_delete__(pvVar31);
                  }
                  lVar23 = lVar23 + 0x18;
                  uVar32 = uVar32 - 1;
                } while (uVar32 != 0);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != (uVar22 & 0xffffffff));
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar7);
      }
      goto LAB_001504e2;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_001504e2:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar16);
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
  return;
}

Assistant:

void
readFile (
    const std::string& filename,
    int                channelCount,
    bool               bulkRead,
    bool               randomChannels)
{
    if (randomChannels) { cout << " reading random channels " << flush; }
    else
    {
        cout << " reading all channels " << flush;
    }

    DeepScanLineInputFile file (filename.c_str (), 8);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());

    const Box2i& dataWindow = fileHeader.dataWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&localSampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
        sizeof (unsigned int) * 1,       // xStride// 9
        sizeof (unsigned int) * width)); // yStride// 10

    vector<int> read_channel (channelCount);

    int channels_added = 0;

    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str, // name // 6
                DeepSlice (
                    type, // type // 7
                    (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8)
                    pointerSize * 1,     // xStride// 9
                    pointerSize * width, // yStride// 10
                    sampleSize));        // sampleStride
            channels_added++;
        }
    }

    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }
        }

        file.readPixels (dataWindow.min.y, dataWindow.max.y);
    }

    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts (y);

            for (int j = 0; j < width; j++)
                assert (localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if (localSampleCount[i][j] > 0 &&
                        (!randomChannels || read_channel[k] == 1))
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] =
                                new unsigned int[localSampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[localSampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
                for (int f = 0; f < fillChannels; ++f)
                {
                    data[f + channelCount][i][j] =
                        new float[localSampleCount[i][j]];
                }
            }

            file.readPixels (y);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value =
                                (unsigned int*) (data[k][i][j]);
                            if (value[l] !=
                                static_cast<unsigned int> (i * width + j) %
                                    2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                value[l] ==
                                static_cast<unsigned int> (i * width + j) %
                                    2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((half*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*) (data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is "
                                     << value[l] << endl
                                     << flush;
                            assert (
                                ((float*) (data[k][i][j]))[l] ==
                                (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if (!randomChannels || read_channel[k] == 1)
                {
                    if (channelTypes[k] == 0)
                        delete[](unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                    if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
                }
            }
            for (int f = 0; f < fillChannels; ++f)
            {
                delete[](float*) data[f + channelCount][i][j];
            }
        }
}